

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O3

int Abc_NtkDsdLocal(Abc_Ntk_t *pNtk,int fVerbose,int fRecursive)

{
  DdManager *pDVar1;
  Abc_Obj_t *pAVar2;
  DdNode **ppDVar3;
  DdNode *f;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Dsd_Manager_t *pDsdMan;
  uint *__ptr;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  Dsd_Node_t *pDVar11;
  DdNode *n;
  DdNode *pDVar12;
  Dsd_Node_t *p;
  Dsd_Node_t **__ptr_00;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pNode;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int pCounters [11];
  ulong local_e0;
  ulong local_d0;
  int local_bc;
  ulong local_b8;
  long local_b0;
  Abc_Obj_t *local_a8;
  int local_9c;
  Abc_Ntk_t *local_98;
  uint *local_90;
  void *local_88;
  Dsd_Manager_t *local_80;
  ulong local_78;
  DdNode *local_70;
  uint local_68 [9];
  ulong uStack_44;
  
  pDVar1 = (DdManager *)pNtk->pManFunc;
  local_68[8] = 0;
  uStack_44 = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_9c = fVerbose;
  if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDsd.c"
                  ,0x149,"int Abc_NtkDsdLocal(Abc_Ntk_t *, int, int)");
  }
  Abc_NtkMinimumBase(pNtk);
  uVar15 = 0;
  pDsdMan = Dsd_ManagerStart(pDVar1,pDVar1->size,0);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar9 = malloc(800);
  *(void **)(__ptr + 2) = pvVar9;
  pVVar10 = pNtk->vObjs;
  local_98 = pNtk;
  if (0 < pVVar10->nSize) {
    uVar16 = 100;
    lVar17 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar10->pArray[lVar17];
      if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
         (iVar4 = Abc_NodeIsForDsd(pAVar2), iVar4 != 0)) {
        uVar5 = (uint)uVar16;
        if (uVar15 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar9;
            *__ptr = 0x10;
            uVar16 = 0x10;
          }
          else {
            uVar16 = (ulong)(uVar5 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc(uVar16 * 8);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),uVar16 * 8);
            }
            *(void **)(__ptr + 2) = pvVar9;
            *__ptr = uVar5 * 2;
          }
        }
        else {
          pvVar9 = *(void **)(__ptr + 2);
        }
        lVar14 = (long)(int)uVar15;
        uVar15 = uVar15 + 1;
        __ptr[1] = uVar15;
        *(Abc_Obj_t **)((long)pvVar9 + lVar14 * 8) = pAVar2;
      }
      lVar17 = lVar17 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar17 < pVVar10->nSize);
    if (0 < (int)uVar15) {
      lVar17 = 0;
      local_e0 = uVar16;
      local_d0 = uVar16;
      local_90 = __ptr;
      local_80 = pDsdMan;
      do {
        local_88 = *(void **)(__ptr + 2);
        pAVar2 = *(Abc_Obj_t **)((long)local_88 + lVar17 * 8);
        pDVar1 = (DdManager *)pAVar2->pNtk->pManFunc;
        pDVar11 = Dsd_DecomposeOne(pDsdMan,(DdNode *)(pAVar2->field_5).pData);
        local_b0 = lVar17;
        if (fRecursive == 0) {
          uVar5 = (pAVar2->vFanins).nSize;
LAB_002bb165:
          local_b8 = uVar16;
          if (0 < (int)uVar5) {
            lVar17 = 0;
            do {
              iVar4 = *(int *)(pAVar2->pNtk->vObjs->pArray + (pAVar2->vFanins).pArray[lVar17]);
              p = Dsd_ManagerReadInput(pDsdMan,(int)lVar17);
              Dsd_NodeSetMark(p,iVar4);
              lVar17 = lVar17 + 1;
            } while (lVar17 < (pAVar2->vFanins).nSize);
          }
          __ptr_00 = Dsd_TreeCollectNodesDfsOne
                               (pDsdMan,(Dsd_Node_t *)((ulong)pDVar11 & 0xfffffffffffffffe),
                                &local_bc);
          __ptr = local_90;
          if (local_bc < 1) {
            if (__ptr_00 != (Dsd_Node_t **)0x0) {
              free(__ptr_00);
            }
LAB_002bb650:
            __assert_fail("pRoot",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDsd.c"
                          ,0x1b0,
                          "void Abc_NodeDecompDsdAndMux(Abc_Obj_t *, Vec_Ptr_t *, Dsd_Manager_t *, int, int *)"
                         );
          }
          lVar17 = 0;
          uVar16 = local_b8;
          do {
            pAVar13 = Abc_NtkDsdConstructNode(pDsdMan,__ptr_00[lVar17],pAVar2->pNtk,(int *)local_68)
            ;
            iVar4 = Abc_NodeIsForDsd(pAVar13);
            if ((fRecursive != 0) && (iVar4 != 0)) {
              uVar5 = (uint)local_e0;
              if (uVar15 == uVar5) {
                if ((int)uVar5 < 0x10) {
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar9 = malloc(0x80);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
                  }
                  *(void **)(__ptr + 2) = pvVar9;
                  *__ptr = 0x10;
                  uVar16 = 0x10;
                  local_d0 = 0x10;
                  local_e0 = 0x10;
                }
                else {
                  uVar16 = (ulong)(uVar5 * 2);
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar9 = malloc(uVar16 * 8);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(__ptr + 2),uVar16 * 8);
                  }
                  *(void **)(__ptr + 2) = pvVar9;
                  *__ptr = uVar5 * 2;
                  local_e0 = uVar16;
                  local_d0 = uVar16;
                }
              }
              else {
                pvVar9 = *(void **)(__ptr + 2);
              }
              lVar14 = (long)(int)uVar15;
              uVar15 = uVar15 + 1;
              *(Abc_Obj_t **)((long)pvVar9 + lVar14 * 8) = pAVar13;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < local_bc);
          free(__ptr_00);
          if (pAVar13 == (Abc_Obj_t *)0x0) goto LAB_002bb650;
          Abc_ObjRemoveFanins(pAVar2);
          Abc_ObjAddFanin(pAVar2,pAVar13);
          Cudd_RecursiveDeref(pDVar1,(DdNode *)(pAVar2->field_5).pData);
          pDVar12 = (DdNode *)((ulong)((uint)pDVar11 & 1) ^ (ulong)*pDVar1->vars);
          lVar17 = local_b0;
        }
        else {
          uVar6 = Dsd_NodeReadDecsNum((Dsd_Node_t *)((ulong)pDVar11 & 0xfffffffffffffffe));
          uVar5 = (pAVar2->vFanins).nSize;
          if (uVar6 != uVar5) goto LAB_002bb165;
          if ((int)uVar6 < 1) {
            lVar17 = -1;
          }
          else {
            local_70 = (DdNode *)(pAVar2->field_5).pData;
            local_78 = (ulong)uVar6;
            iVar4 = -1;
            uVar18 = 0;
            iVar19 = 1000000;
            local_b8 = uVar16;
            do {
              f = local_70;
              pDVar12 = pDVar1->vars[uVar18];
              n = Cudd_Cofactor(pDVar1,local_70,(DdNode *)((ulong)pDVar12 ^ 1));
              Cudd_Ref(n);
              pDVar12 = Cudd_Cofactor(pDVar1,f,pDVar12);
              Cudd_Ref(pDVar12);
              iVar7 = Cudd_SupportSize(pDVar1,n);
              local_a8 = (Abc_Obj_t *)CONCAT44(local_a8._4_4_,iVar7);
              iVar8 = Cudd_SupportSize(pDVar1,pDVar12);
              Cudd_RecursiveDeref(pDVar1,n);
              Cudd_RecursiveDeref(pDVar1,pDVar12);
              iVar8 = iVar8 + (int)local_a8;
              iVar7 = iVar19;
              if (iVar8 <= iVar19) {
                iVar7 = iVar8;
              }
              if (iVar8 < iVar19) {
                iVar4 = (int)uVar18;
              }
              uVar18 = uVar18 + 1;
              iVar19 = iVar7;
            } while (local_78 != uVar18);
            lVar17 = (long)iVar4;
            __ptr = local_90;
            pDsdMan = local_80;
            uVar16 = local_b8;
          }
          local_a8 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar17]];
          pAVar13 = Abc_NtkCloneObj(pAVar2);
          pDVar12 = Cudd_Cofactor(pDVar1,(DdNode *)(pAVar2->field_5).pData,
                                  (DdNode *)((ulong)pDVar1->vars[lVar17] ^ 1));
          (pAVar13->field_5).pData = pDVar12;
          Cudd_Ref(pDVar12);
          Abc_NodeMinimumBase(pAVar13);
          iVar4 = Abc_NodeIsForDsd(pAVar13);
          if (iVar4 != 0) {
            uVar5 = (uint)local_d0;
            pvVar9 = local_88;
            if (uVar15 == uVar5) {
              if ((int)uVar5 < 0x10) {
                if (local_88 == (void *)0x0) {
                  pvVar9 = malloc(0x80);
                }
                else {
                  pvVar9 = realloc(local_88,0x80);
                }
                uVar16 = 0x10;
              }
              else {
                uVar16 = (ulong)(uVar5 * 2);
                if (local_88 == (void *)0x0) {
                  pvVar9 = malloc(uVar16 * 8);
                }
                else {
                  pvVar9 = realloc(local_88,uVar16 * 8);
                }
              }
              *(void **)(__ptr + 2) = pvVar9;
              *__ptr = (uint)uVar16;
              local_d0 = uVar16;
            }
            lVar14 = (long)(int)uVar15;
            uVar15 = uVar15 + 1;
            *(Abc_Obj_t **)((long)pvVar9 + lVar14 * 8) = pAVar13;
            local_e0 = local_d0;
          }
          pNode = Abc_NtkCloneObj(pAVar2);
          pDVar12 = Cudd_Cofactor(pDVar1,(DdNode *)(pAVar2->field_5).pData,pDVar1->vars[lVar17]);
          (pNode->field_5).pData = pDVar12;
          Cudd_Ref(pDVar12);
          Abc_NodeMinimumBase(pNode);
          iVar4 = Abc_NodeIsForDsd(pNode);
          lVar17 = local_b0;
          if (iVar4 != 0) {
            uVar5 = (uint)uVar16;
            if (uVar15 == uVar5) {
              if ((int)uVar5 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar9 = malloc(0x80);
                }
                else {
                  pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
                }
                *(void **)(__ptr + 2) = pvVar9;
                *__ptr = 0x10;
                uVar16 = 0x10;
              }
              else {
                uVar16 = (ulong)(uVar5 * 2);
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar9 = malloc(uVar16 * 8);
                }
                else {
                  pvVar9 = realloc(*(void **)(__ptr + 2),uVar16 * 8);
                }
                *(void **)(__ptr + 2) = pvVar9;
                *__ptr = uVar5 * 2;
              }
            }
            else {
              pvVar9 = *(void **)(__ptr + 2);
            }
            lVar14 = (long)(int)uVar15;
            uVar15 = uVar15 + 1;
            *(Abc_Obj_t **)((long)pvVar9 + lVar14 * 8) = pNode;
            local_e0 = uVar16 & 0xffffffff;
            local_d0 = local_e0;
          }
          Abc_ObjRemoveFanins(pAVar2);
          Abc_ObjAddFanin(pAVar2,local_a8);
          Abc_ObjAddFanin(pAVar2,pNode);
          Abc_ObjAddFanin(pAVar2,pAVar13);
          Cudd_RecursiveDeref(pDVar1,(DdNode *)(pAVar2->field_5).pData);
          ppDVar3 = pDVar1->vars;
          pDVar12 = Cudd_bddIte(pDVar1,*ppDVar3,ppDVar3[1],ppDVar3[2]);
        }
        (pAVar2->field_5).pData = pDVar12;
        Cudd_Ref(pDVar12);
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)uVar15);
    }
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (local_9c != 0) {
    puts("Number of non-decomposable functions:");
    uVar16 = 3;
    do {
      printf("Inputs = %d.  Functions = %6d.\n",uVar16 & 0xffffffff,(ulong)local_68[uVar16]);
      uVar16 = uVar16 + 1;
    } while (uVar16 != 10);
    printf("Inputs > %d.  Functions = %6d.\n",9,uStack_44 >> 0x20);
  }
  Dsd_ManagerStop(pDsdMan);
  iVar4 = Abc_NtkCheck(local_98);
  if (iVar4 == 0) {
    puts("Abc_NtkDsdRecursive: The network check has failed.");
  }
  return (uint)(iVar4 != 0);
}

Assistant:

int Abc_NtkDsdLocal( Abc_Ntk_t * pNtk, int fVerbose, int fRecursive )
{
    Dsd_Manager_t * pManDsd;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    Vec_Ptr_t * vNodes;
    int i;
    int pCounters[11] = {0};

    assert( Abc_NtkIsBddLogic(pNtk) );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtk );

    // start the DSD manager
    pManDsd = Dsd_ManagerStart( dd, dd->size, 0 );

    // collect nodes for decomposition
    vNodes = Abc_NtkCollectNodesForDsd( pNtk );
    for ( i = 0; i < vNodes->nSize; i++ )
        Abc_NodeDecompDsdAndMux( (Abc_Obj_t *)vNodes->pArray[i], vNodes, pManDsd, fRecursive, pCounters );
    Vec_PtrFree( vNodes );

    if ( fVerbose )
    {
        printf( "Number of non-decomposable functions:\n" );
        for ( i = 3; i < 10; i++ )
            printf( "Inputs = %d.  Functions = %6d.\n", i, pCounters[i] );
        printf( "Inputs > %d.  Functions = %6d.\n", 9, pCounters[10] );
    }

    // stop the DSD manager
    Dsd_ManagerStop( pManDsd );

    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkDsdRecursive: The network check has failed.\n" );
        return 0;
    }
    return 1;
}